

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipeMsg.cpp
# Opt level: O3

bool MsgHelper::checkClientMsg(uint8_t *buf)

{
  return (bool)(0xecU >> (*buf & 0x1f) & *buf < 8);
}

Assistant:

bool MsgHelper::checkClientMsg(uint8_t* buf)
{
	PIPEMSG_TYPE type = (PIPEMSG_TYPE)buf[0];
	return type == PIPEMSG_TYPE::S2C_RESPONSE ||
		type == PIPEMSG_TYPE::SEND_TCP_DATA ||
		type == PIPEMSG_TYPE::S2C_UDP_DATA ||
		type == PIPEMSG_TYPE::S2C_DISCONNECT ||
		type == PIPEMSG_TYPE::S2C_CANNOT_RESOLVE_ADDR;
}